

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::ArrayColumnWriter::ArrayColumnWriter
          (ArrayColumnWriter *this,ParquetWriter *writer,ParquetColumnSchema *column_schema,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *schema_path_p,
          unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
          *child_writer_p,bool can_have_nulls)

{
  byte bVar1;
  ParquetColumnSchema *in_RCX;
  ParquetWriter *in_RDX;
  ListColumnWriter *in_RSI;
  undefined8 *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_R8;
  byte in_R9B;
  undefined1 in_stack_ffffffffffffffcf;
  undefined7 in_stack_ffffffffffffffd0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *schema_path_p_00;
  ParquetColumnSchema *column_schema_00;
  
  bVar1 = in_R9B & 1;
  schema_path_p_00 = in_R8;
  column_schema_00 = in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector(in_R8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)in_RCX);
  unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::unique_ptr
            ((unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true> *)
             in_R8,(unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                    *)in_RCX);
  ListColumnWriter::ListColumnWriter
            (in_RSI,in_RDX,column_schema_00,schema_path_p_00,
             (unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true> *)
             CONCAT17(bVar1,in_stack_ffffffffffffffd0),(bool)in_stack_ffffffffffffffcf);
  unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true> *)
             0x5b654f);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *)0x5b6559);
  *in_RDI = &PTR__ArrayColumnWriter_00c04a80;
  return;
}

Assistant:

ArrayColumnWriter(ParquetWriter &writer, const ParquetColumnSchema &column_schema, vector<string> schema_path_p,
	                  unique_ptr<ColumnWriter> child_writer_p, bool can_have_nulls)
	    : ListColumnWriter(writer, column_schema, std::move(schema_path_p), std::move(child_writer_p), can_have_nulls) {
	}